

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

bool checkInterfaceDirs(string *prepro,cmGeneratorTarget *target,string *prop)

{
  cmMakefile *this;
  MessageType t;
  bool bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  PolicyStatus PVar7;
  char *b;
  cmLocalGenerator *pcVar8;
  char *__s1;
  char *__s2;
  size_type sVar9;
  ostream *poVar10;
  string *psVar11;
  PolicyID id;
  PolicyID id_00;
  char *pcVar12;
  pointer input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string local_340;
  ostringstream s;
  ostringstream e;
  
  this = target->Makefile;
  std::__cxx11::string::string((string *)&e,"CMAKE_INSTALL_PREFIX",(allocator *)&s);
  b = cmMakefile::GetSafeDefinition(this,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  pcVar8 = cmGeneratorTarget::GetLocalGenerator(target);
  __s1 = cmLocalGenerator::GetSourceDirectory(pcVar8);
  pcVar8 = cmGeneratorTarget::GetLocalGenerator(target);
  __s2 = cmLocalGenerator::GetBinaryDirectory(pcVar8);
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorExpression::Split(prepro,&parts);
  iVar6 = strcmp(__s1,__s2);
  bVar2 = 0;
  input = parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (input == parts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&parts);
      return (bool)(~bVar2 & 1);
    }
    sVar9 = cmGeneratorExpression::Find(input);
    if (sVar9 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      if (sVar9 == 0xffffffffffffffff) {
LAB_003f7713:
        t = FATAL_ERROR;
LAB_003f7715:
        _s = (input->_M_dataplus)._M_p;
        bVar1 = cmHasLiteralPrefix<char_const*,18ul>((char **)&s,(char (*) [18])0x55a6a9);
        if (!bVar1) {
          bVar1 = cmsys::SystemTools::FileIsFullPath((input->_M_dataplus)._M_p);
          if (!bVar1) {
            poVar10 = std::operator<<((ostream *)&e,"Target \"");
            psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(target);
            poVar10 = std::operator<<(poVar10,(string *)psVar11);
            poVar10 = std::operator<<(poVar10,"\" ");
            poVar10 = std::operator<<(poVar10,(string *)prop);
            poVar10 = std::operator<<(poVar10," property contains relative path:\n  \"");
            poVar10 = std::operator<<(poVar10,(string *)input);
            std::operator<<(poVar10,"\"");
            pcVar8 = cmGeneratorTarget::GetLocalGenerator(target);
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(pcVar8,t,(string *)&s);
            std::__cxx11::string::~string((string *)&s);
          }
          bVar1 = isSubDirectory((input->_M_dataplus)._M_p,__s2);
          bVar3 = isSubDirectory((input->_M_dataplus)._M_p,__s1);
          bVar4 = isSubDirectory((input->_M_dataplus)._M_p,b);
          if (bVar4) {
            if (bVar1) {
              bVar4 = isSubDirectory(b,__s2);
              if (bVar3 && bVar4) {
LAB_003f789a:
                bVar4 = isSubDirectory(b,__s1);
              }
            }
            else {
              bVar4 = true;
              if (bVar3) goto LAB_003f789a;
            }
            bVar5 = std::operator==(prop,"INTERFACE_INCLUDE_DIRECTORIES");
            if ((bVar4 == false) && (bVar5)) {
              PVar7 = cmGeneratorTarget::GetPolicyStatusCMP0052(target);
              if (PVar7 != OLD) {
                if (PVar7 != WARN) goto LAB_003f7a31;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
                cmPolicies::GetPolicyWarning_abi_cxx11_(&local_340,(cmPolicies *)0x34,id_00);
                poVar10 = std::operator<<((ostream *)&s,(string *)&local_340);
                std::operator<<(poVar10,"\n");
                std::__cxx11::string::~string((string *)&local_340);
                poVar10 = std::operator<<((ostream *)&s,"Directory:\n    \"");
                poVar10 = std::operator<<(poVar10,(string *)input);
                poVar10 = std::operator<<(poVar10,
                                          "\"\nin INTERFACE_INCLUDE_DIRECTORIES of target \"");
                psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(target);
                poVar10 = std::operator<<(poVar10,(string *)psVar11);
                poVar10 = std::operator<<(poVar10,
                                          "\" is a subdirectory of the install directory:\n    \"");
                poVar10 = std::operator<<(poVar10,b);
                poVar10 = std::operator<<(poVar10,"\"\nhowever it is also a subdirectory of the ");
                pcVar12 = "source";
                if (bVar1) {
                  pcVar12 = "build";
                }
                poVar10 = std::operator<<(poVar10,pcVar12);
                poVar10 = std::operator<<(poVar10," tree:\n    \"");
                pcVar12 = __s1;
                if (bVar1) {
                  pcVar12 = __s2;
                }
                poVar10 = std::operator<<(poVar10,pcVar12);
                poVar10 = std::operator<<(poVar10,"\"");
                std::endl<char,std::char_traits<char>>(poVar10);
                pcVar8 = cmGeneratorTarget::GetLocalGenerator(target);
                std::__cxx11::stringbuf::str();
                cmLocalGenerator::IssueMessage(pcVar8,AUTHOR_WARNING,&local_340);
                std::__cxx11::string::~string((string *)&local_340);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
              }
            }
            else {
LAB_003f7a31:
              if (bVar4 == false) goto LAB_003f7a3a;
            }
          }
          else {
LAB_003f7a3a:
            if (bVar1) {
              poVar10 = std::operator<<((ostream *)&e,"Target \"");
              psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(target);
              poVar10 = std::operator<<(poVar10,(string *)psVar11);
              poVar10 = std::operator<<(poVar10,"\" ");
              poVar10 = std::operator<<(poVar10,(string *)prop);
              poVar10 = std::operator<<(poVar10," property contains path:\n  \"");
              poVar10 = std::operator<<(poVar10,(string *)input);
              std::operator<<(poVar10,"\"\nwhich is prefixed in the build directory.");
              pcVar8 = cmGeneratorTarget::GetLocalGenerator(target);
              std::__cxx11::stringbuf::str();
              cmLocalGenerator::IssueMessage(pcVar8,t,(string *)&s);
              std::__cxx11::string::~string((string *)&s);
            }
            if (bVar3 && iVar6 != 0) {
              poVar10 = std::operator<<((ostream *)&e,"Target \"");
              psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(target);
              poVar10 = std::operator<<(poVar10,(string *)psVar11);
              poVar10 = std::operator<<(poVar10,"\" ");
              poVar10 = std::operator<<(poVar10,(string *)prop);
              poVar10 = std::operator<<(poVar10," property contains path:\n  \"");
              poVar10 = std::operator<<(poVar10,(string *)input);
              std::operator<<(poVar10,"\"\nwhich is prefixed in the source directory.");
              pcVar8 = cmGeneratorTarget::GetLocalGenerator(target);
              std::__cxx11::stringbuf::str();
              cmLocalGenerator::IssueMessage(pcVar8,t,(string *)&s);
              std::__cxx11::string::~string((string *)&s);
            }
          }
        }
      }
      else {
        bVar1 = std::operator==(prop,"INTERFACE_INCLUDE_DIRECTORIES");
        if ((!bVar1) || (PVar7 = cmGeneratorTarget::GetPolicyStatusCMP0041(target), PVar7 - NEW < 3)
           ) {
          bVar2 = 1;
          goto LAB_003f7713;
        }
        if (PVar7 != OLD) {
          if (PVar7 != WARN) goto LAB_003f7713;
          cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&s,(cmPolicies *)0x29,id);
          poVar10 = std::operator<<((ostream *)&e,(string *)&s);
          std::operator<<(poVar10,"\n");
          std::__cxx11::string::~string((string *)&s);
          t = WARNING;
          goto LAB_003f7715;
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
    input = input + 1;
  } while( true );
}

Assistant:

static bool checkInterfaceDirs(const std::string &prepro,
                      cmGeneratorTarget *target, const std::string& prop)
{
  const char* installDir =
            target->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
  const char* topSourceDir =
      target->GetLocalGenerator()->GetSourceDirectory();
  const char* topBinaryDir =
      target->GetLocalGenerator()->GetBinaryDirectory();

  std::vector<std::string> parts;
  cmGeneratorExpression::Split(prepro, parts);

  const bool inSourceBuild = strcmp(topSourceDir, topBinaryDir) == 0;

  bool hadFatalError = false;

  for(std::vector<std::string>::iterator li = parts.begin();
      li != parts.end(); ++li)
    {
    size_t genexPos = cmGeneratorExpression::Find(*li);
    if (genexPos == 0)
      {
      continue;
      }
    cmake::MessageType messageType = cmake::FATAL_ERROR;
    std::ostringstream e;
    if (genexPos != std::string::npos)
      {
      if (prop == "INTERFACE_INCLUDE_DIRECTORIES")
        {
        switch (target->GetPolicyStatusCMP0041())
          {
          case cmPolicies::WARN:
            messageType = cmake::WARNING;
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0041) << "\n";
            break;
          case cmPolicies::OLD:
            continue;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            hadFatalError = true;
            break; // Issue fatal message.
          }
        }
      else
        {
        hadFatalError = true;
        }
      }
    if (cmHasLiteralPrefix(li->c_str(), "${_IMPORT_PREFIX}"))
      {
      continue;
      }
    if (!cmSystemTools::FileIsFullPath(li->c_str()))
      {
      e << "Target \"" << target->GetName() << "\" " << prop <<
           " property contains relative path:\n"
           "  \"" << *li << "\"";
      target->GetLocalGenerator()->IssueMessage(messageType, e.str());
      }
    bool inBinary = isSubDirectory(li->c_str(), topBinaryDir);
    bool inSource = isSubDirectory(li->c_str(), topSourceDir);
    if (isSubDirectory(li->c_str(), installDir))
      {
      // The include directory is inside the install tree.  If the
      // install tree is not inside the source tree or build tree then
      // fall through to the checks below that the include directory is not
      // also inside the source tree or build tree.
      bool shouldContinue =
        (!inBinary || isSubDirectory(installDir, topBinaryDir)) &&
        (!inSource || isSubDirectory(installDir, topSourceDir));

      if (prop == "INTERFACE_INCLUDE_DIRECTORIES")
        {
        if (!shouldContinue)
          {
          switch(target->GetPolicyStatusCMP0052())
            {
            case cmPolicies::WARN:
              {
              std::ostringstream s;
              s << cmPolicies::GetPolicyWarning(cmPolicies::CMP0052) << "\n";
              s << "Directory:\n    \"" << *li << "\"\nin "
                "INTERFACE_INCLUDE_DIRECTORIES of target \""
                << target->GetName() << "\" is a subdirectory of the install "
                "directory:\n    \"" << installDir << "\"\nhowever it is also "
                "a subdirectory of the " << (inBinary ? "build" : "source")
                << " tree:\n    \"" << (inBinary ? topBinaryDir : topSourceDir)
                << "\"" << std::endl;
              target->GetLocalGenerator()->IssueMessage(cmake::AUTHOR_WARNING,
                                                  s.str());
              }
            case cmPolicies::OLD:
              shouldContinue = true;
              break;
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::NEW:
              break;
            }
          }
        }
      if (shouldContinue)
        {
        continue;
        }
      }
    if (inBinary)
      {
      e << "Target \"" << target->GetName() << "\" " << prop <<
           " property contains path:\n"
           "  \"" << *li << "\"\nwhich is prefixed in the build directory.";
      target->GetLocalGenerator()->IssueMessage(messageType, e.str());
      }
    if (!inSourceBuild)
      {
      if (inSource)
        {
        e << "Target \"" << target->GetName() << "\" " << prop <<
            " property contains path:\n"
            "  \"" << *li << "\"\nwhich is prefixed in the source directory.";
        target->GetLocalGenerator()->IssueMessage(messageType, e.str());
        }
      }
    }
  return !hadFatalError;
}